

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O1

void SL::WS_LITE::
     write<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>,SL::WS_LITE::WSMessage>
               (shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *socket,WSMessage *msg)

{
  pointer pcVar1;
  size_t sVar2;
  long *plVar3;
  string *psVar4;
  size_type *psVar5;
  long lVar6;
  size_t sVar7;
  anon_union_8_2_7f9ed18d source;
  anon_union_2_2_7f9ed18d dest;
  error_code ec;
  OpCode local_80;
  byte bStack_7f;
  undefined2 uStack_7e;
  undefined4 uStack_7c;
  undefined2 local_78;
  string local_70;
  string *local_50 [2];
  string local_40;
  
  uStack_7e = 0;
  uStack_7c = 0;
  local_78 = 0;
  local_80 = msg->code & 0xf | 0x80;
  pcVar1 = (pointer)msg->len;
  if (pcVar1 < (pointer)0x7e) {
    bStack_7f = (byte)pcVar1 | 0x80;
    sVar7 = 2;
  }
  else {
    psVar4 = &local_70;
    if (pcVar1 < (pointer)0x10000) {
      local_70._M_dataplus._M_p._0_2_ = (short)pcVar1;
      lVar6 = 1;
      do {
        *(undefined1 *)((long)local_50 + lVar6) = *(undefined1 *)&(psVar4->_M_dataplus)._M_p;
        psVar4 = (string *)((long)&(psVar4->_M_dataplus)._M_p + 1);
        lVar6 = lVar6 + -1;
      } while (lVar6 == 0);
      uStack_7e = local_50[0]._0_2_;
      sVar7 = 4;
      bStack_7f = 0xfe;
    }
    else {
      local_70._M_dataplus._M_p = pcVar1;
      lVar6 = 8;
      do {
        *(undefined1 *)((long)local_50 + lVar6 + -1) = *(undefined1 *)&(psVar4->_M_dataplus)._M_p;
        psVar4 = (string *)((long)&(psVar4->_M_dataplus)._M_p + 1);
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      uStack_7e = SUB82(local_50[0],0);
      uStack_7c = (undefined4)((ulong)local_50[0] >> 0x10);
      local_78 = (undefined2)((ulong)local_50[0] >> 0x30);
      sVar7 = 10;
      bStack_7f = 0xff;
    }
  }
  if (pcVar1 < (pointer)0xffffffff) {
    writeexpire_from_now<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
              (socket,(seconds)(((((socket->
                                   super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->Parent).
                                 super___shared_ptr<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->WriteTimeout).__r);
    local_40.field_2._M_allocated_capacity._0_4_ = 0;
    local_40.field_2._8_8_ = std::_V2::system_category();
    local_70._M_dataplus._M_p = (pointer)&local_80;
    local_50[0] = &local_70;
    local_70._M_string_length = sVar7;
    sVar2 = asio::detail::
            write_buffer_sequence<asio::basic_stream_socket<asio::ip::tcp>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t>
                      (&((socket->
                         super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->Socket,local_50[0],local_50,&local_40.field_2);
    if (local_40.field_2._M_allocated_capacity._0_4_ == 0) {
      if (sVar7 != sVar2) {
        __assert_fail("sendsize == bytes_transferred",
                      "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
                      ,0xa4,
                      "void SL::WS_LITE::write(const SOCKETTYPE &, const SENDBUFFERTYPE &) [isServer = false, SOCKETTYPE = std::shared_ptr<SL::WS_LITE::WebSocket<false, asio::basic_stream_socket<asio::ip::tcp>>>, SENDBUFFERTYPE = SL::WS_LITE::WSMessage]"
                     );
      }
      writeend<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>,SL::WS_LITE::WSMessage>
                (socket,msg,false);
    }
    else {
      (**(code **)(*(long *)local_40.field_2._8_8_ + 0x20))(local_50);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x15e8a8);
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_70.field_2._M_allocated_capacity = *psVar5;
        local_70.field_2._8_8_ = plVar3[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar5;
        local_70._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_70._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      handleclose<std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                (socket,0x3ea,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (local_50[0] != &local_40) {
        operator_delete(local_50[0],(ulong)(local_40._M_dataplus._M_p + 1));
      }
    }
    return;
  }
  __assert_fail("msg.len < UINT32_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
                ,0x9e,
                "void SL::WS_LITE::write(const SOCKETTYPE &, const SENDBUFFERTYPE &) [isServer = false, SOCKETTYPE = std::shared_ptr<SL::WS_LITE::WebSocket<false, asio::basic_stream_socket<asio::ip::tcp>>>, SENDBUFFERTYPE = SL::WS_LITE::WSMessage]"
               );
}

Assistant:

inline void write(const SOCKETTYPE &socket, const SENDBUFFERTYPE &msg)
    {
        size_t sendsize = 0;
        unsigned char header[10] = {};

        setFin(header, 0xFF);
        set_MaskBitForSending(header, isServer);
        setOpCode(header, msg.code);
        setrsv1(header, 0x00);
        setrsv2(header, 0x00);
        setrsv3(header, 0x00);

        if (msg.len <= 125) {
            setpayloadLength1(header, hton(static_cast<unsigned char>(msg.len)));
            sendsize = 2;
        }
        else if (msg.len > USHRT_MAX) {
            setpayloadLength8(header, hton(static_cast<unsigned long long int>(msg.len)));
            setpayloadLength1(header, 127);
            sendsize = 10;
        }
        else {
            setpayloadLength2(header, hton(static_cast<unsigned short>(msg.len)));
            setpayloadLength1(header, 126);
            sendsize = 4;
        }

        assert(msg.len < UINT32_MAX);
        writeexpire_from_now<isServer>(socket, socket->Parent->WriteTimeout);
        std::error_code ec;
        auto bytes_transferred = asio::write(socket->Socket, asio::buffer(header, sendsize), ec);
        UNUSED(bytes_transferred);
        if (!ec) {
            assert(sendsize == bytes_transferred);
            writeend<isServer>(socket, msg, isServer);
        }
        else {
            handleclose(socket, 1002, "write header failed " + ec.message());
        }
    }